

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  FieldDescriptor *this;
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  int32 iVar6;
  uint32 uVar7;
  LogMessage *pLVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Reflection *this_00;
  Reflection *this_01;
  MessageFactory *pMVar9;
  MessageFactory *pMVar10;
  MessageFactory *pMVar11;
  MapFieldBase *this_02;
  MapFieldBase *this_03;
  Message *pMVar12;
  Message *pMVar13;
  uint64 uVar14;
  EnumValueDescriptor *pEVar15;
  int64 iVar16;
  UnknownFieldSet *this_04;
  UnknownFieldSet *other;
  bool bVar17;
  float fVar18;
  LogFinisher local_b1;
  MessageFactory *local_b0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_70;
  string local_50;
  
  if (from == to) {
    LogMessage::LogMessage
              ((LogMessage *)&fields,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x48);
    pLVar8 = LogMessage::operator<<((LogMessage *)&fields,"CHECK failed: (&from) != (to): ");
    LogFinisher::operator=(&local_b1,pLVar8);
    LogMessage::~LogMessage((LogMessage *)&fields);
  }
  iVar3 = (*(from->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar4 = (*(to->super_MessageLite)._vptr_MessageLite[0x15])();
  if (CONCAT44(extraout_var_00,iVar4) != CONCAT44(extraout_var,iVar3)) {
    LogMessage::LogMessage
              ((LogMessage *)&fields,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x4b);
    pLVar8 = LogMessage::operator<<
                       ((LogMessage *)&fields,
                        "CHECK failed: (to->GetDescriptor()) == (descriptor): ");
    pLVar8 = LogMessage::operator<<(pLVar8,"Tried to merge messages of different types ");
    pLVar8 = LogMessage::operator<<(pLVar8,"(merge ");
    pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var,iVar3) + 8));
    pLVar8 = LogMessage::operator<<(pLVar8," to ");
    iVar3 = (*(to->super_MessageLite)._vptr_MessageLite[0x15])();
    pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_01,iVar3) + 8));
    pLVar8 = LogMessage::operator<<(pLVar8,")");
    LogFinisher::operator=(&local_b1,pLVar8);
    LogMessage::~LogMessage((LogMessage *)&fields);
  }
  this_00 = GetReflectionOrDie(from);
  this_01 = GetReflectionOrDie(to);
  local_b0 = Reflection::GetMessageFactory(this_00);
  pMVar9 = MessageFactory::generated_factory();
  pMVar10 = Reflection::GetMessageFactory(this_01);
  pMVar11 = MessageFactory::generated_factory();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,from,&fields);
  bVar17 = local_b0 == pMVar9;
  pMVar9 = (MessageFactory *)0x0;
  do {
    if ((MessageFactory *)
        ((long)fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) <= pMVar9) {
      this_04 = Reflection::MutableUnknownFields(this_01,to);
      other = Reflection::GetUnknownFields(this_00,from);
      UnknownFieldSet::MergeFrom(this_04,other);
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      return;
    }
    this = fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)pMVar9];
    local_b0 = pMVar9;
    if (*(int *)(this + 0x3c) == 3) {
      if (((pMVar10 != pMVar11) != bVar17) && (bVar2 = FieldDescriptor::is_map(this), bVar2)) {
        this_02 = Reflection::GetMapData(this_00,from,this);
        this_03 = Reflection::MutableMapData(this_01,to,this);
        bVar2 = MapFieldBase::IsMapValid(this_03);
        if ((bVar2) && (bVar2 = MapFieldBase::IsMapValid(this_02), bVar2)) {
          (*this_03->_vptr_MapFieldBase[8])(this_03,this_02);
          goto switchD_0026c130_default;
        }
      }
      iVar3 = Reflection::FieldSize(this_00,from,this);
      iVar4 = 0;
      if (iVar3 < 1) {
        iVar3 = iVar4;
      }
      for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
        CVar5 = FieldDescriptor::cpp_type(this);
        switch(CVar5) {
        case CPPTYPE_INT32:
          iVar6 = Reflection::GetRepeatedInt32(this_00,from,this,iVar4);
          Reflection::AddInt32(this_01,to,this,iVar6);
          break;
        case CPPTYPE_INT64:
          iVar16 = Reflection::GetRepeatedInt64(this_00,from,this,iVar4);
          Reflection::AddInt64(this_01,to,this,iVar16);
          break;
        case CPPTYPE_UINT32:
          uVar7 = Reflection::GetRepeatedUInt32(this_00,from,this,iVar4);
          Reflection::AddUInt32(this_01,to,this,uVar7);
          break;
        case CPPTYPE_UINT64:
          uVar14 = Reflection::GetRepeatedUInt64(this_00,from,this,iVar4);
          Reflection::AddUInt64(this_01,to,this,uVar14);
          break;
        case CPPTYPE_DOUBLE:
          dVar1 = Reflection::GetRepeatedDouble(this_00,from,this,iVar4);
          Reflection::AddDouble(this_01,to,this,dVar1);
          break;
        case CPPTYPE_FLOAT:
          fVar18 = Reflection::GetRepeatedFloat(this_00,from,this,iVar4);
          Reflection::AddFloat(this_01,to,this,fVar18);
          break;
        case CPPTYPE_BOOL:
          bVar2 = Reflection::GetRepeatedBool(this_00,from,this,iVar4);
          Reflection::AddBool(this_01,to,this,bVar2);
          break;
        case CPPTYPE_ENUM:
          pEVar15 = Reflection::GetRepeatedEnum(this_00,from,this,iVar4);
          Reflection::AddEnum(this_01,to,this,pEVar15);
          break;
        case CPPTYPE_STRING:
          Reflection::GetRepeatedString_abi_cxx11_(&local_50,this_00,from,this,iVar4);
          Reflection::AddString(this_01,to,this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          break;
        case CPPTYPE_MESSAGE:
          pMVar12 = Reflection::AddMessage(this_01,to,this,(MessageFactory *)0x0);
          pMVar13 = Reflection::GetRepeatedMessage(this_00,from,this,iVar4);
          (*(pMVar12->super_MessageLite)._vptr_MessageLite[0x11])(pMVar12,pMVar13);
        }
      }
    }
    else {
      CVar5 = FieldDescriptor::cpp_type(this);
      switch(CVar5) {
      case CPPTYPE_INT32:
        iVar6 = Reflection::GetInt32(this_00,from,this);
        Reflection::SetInt32(this_01,to,this,iVar6);
        break;
      case CPPTYPE_INT64:
        iVar16 = Reflection::GetInt64(this_00,from,this);
        Reflection::SetInt64(this_01,to,this,iVar16);
        break;
      case CPPTYPE_UINT32:
        uVar7 = Reflection::GetUInt32(this_00,from,this);
        Reflection::SetUInt32(this_01,to,this,uVar7);
        break;
      case CPPTYPE_UINT64:
        uVar14 = Reflection::GetUInt64(this_00,from,this);
        Reflection::SetUInt64(this_01,to,this,uVar14);
        break;
      case CPPTYPE_DOUBLE:
        dVar1 = Reflection::GetDouble(this_00,from,this);
        Reflection::SetDouble(this_01,to,this,dVar1);
        break;
      case CPPTYPE_FLOAT:
        fVar18 = Reflection::GetFloat(this_00,from,this);
        Reflection::SetFloat(this_01,to,this,fVar18);
        break;
      case CPPTYPE_BOOL:
        bVar2 = Reflection::GetBool(this_00,from,this);
        Reflection::SetBool(this_01,to,this,bVar2);
        break;
      case CPPTYPE_ENUM:
        pEVar15 = Reflection::GetEnum(this_00,from,this);
        Reflection::SetEnum(this_01,to,this,pEVar15);
        break;
      case CPPTYPE_STRING:
        Reflection::GetString_abi_cxx11_(&local_70,this_00,from,this);
        Reflection::SetString(this_01,to,this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        break;
      case CPPTYPE_MESSAGE:
        pMVar12 = Reflection::MutableMessage(this_01,to,this,(MessageFactory *)0x0);
        pMVar13 = Reflection::GetMessage(this_00,from,this,(MessageFactory *)0x0);
        (*(pMVar12->super_MessageLite)._vptr_MessageLite[0x11])(pMVar12,pMVar13);
      }
    }
switchD_0026c130_default:
    pMVar9 = (MessageFactory *)((long)&local_b0->_vptr_MessageFactory + 1);
  } while( true );
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  GOOGLE_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  GOOGLE_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            to_reflection->AddMessage(to, field)->MergeFrom(
                from_reflection->GetRepeatedMessage(from, field, j));
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          to_reflection->MutableMessage(to, field)->MergeFrom(
              from_reflection->GetMessage(from, field));
          break;
      }
    }
  }

  to_reflection->MutableUnknownFields(to)->MergeFrom(
      from_reflection->GetUnknownFields(from));
}